

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseBuilder::newAlignNode
          (BaseBuilder *this,AlignNode **out,AlignMode alignMode,uint32_t alignment)

{
  Error EVar1;
  Error extraout_EAX;
  Error EVar2;
  AlignNode *pAVar3;
  BaseBuilder *unaff_RBX;
  AlignNode **unaff_R14;
  size_t sStack_28;
  
  *out = (AlignNode *)0x0;
  if (*(long *)&this->_allocator == 0) {
    newAlignNode();
    EVar1 = extraout_EAX;
  }
  else {
    pAVar3 = (AlignNode *)ZoneAllocator::_alloc(&this->_allocator,0x38,&sStack_28);
    EVar2 = 0;
    unaff_RBX = this;
    unaff_R14 = out;
    EVar1 = 0;
    if (pAVar3 != (AlignNode *)0x0) {
      *(undefined8 *)pAVar3 = 0;
      *(undefined8 *)(pAVar3 + 8) = 0;
      pAVar3[0x10] = (AlignNode)0x4;
      pAVar3[0x11] = (AlignNode)(this->_nodeFlags | (kHasNoEffect|kIsCode));
      *(undefined8 *)(pAVar3 + 0x12) = 0;
      *(undefined8 *)(pAVar3 + 0x1a) = 0;
      *(undefined8 *)(pAVar3 + 0x20) = 0;
      *(undefined8 *)(pAVar3 + 0x28) = 0;
      pAVar3[0x12] = (AlignNode)alignMode;
      *(uint32_t *)(pAVar3 + 0x30) = alignment;
      goto LAB_001169c8;
    }
  }
  EVar2 = EVar1;
  pAVar3 = (AlignNode *)0x0;
LAB_001169c8:
  *unaff_R14 = pAVar3;
  if (pAVar3 == (AlignNode *)0x0) {
    EVar2 = BaseEmitter::reportError(&unaff_RBX->super_BaseEmitter,1,(char *)0x0);
  }
  return EVar2;
}

Assistant:

Error BaseBuilder::newAlignNode(AlignNode** out, AlignMode alignMode, uint32_t alignment) {
  *out = nullptr;
  return _newNodeT<AlignNode>(out, alignMode, alignment);
}